

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

Interval * __thiscall
vkt::shaderexecutor::Functions::Sub::doApply
          (Interval *__return_storage_ptr__,Sub *this,EvalContext *ctx,IArgs *iargs)

{
  double dVar1;
  double dVar2;
  Interval *pIVar3;
  Interval **ppIVar4;
  undefined8 *puVar5;
  bool bVar6;
  deBool dVar7;
  Interval local_f8;
  Interval local_e0;
  Interval *local_c8;
  Interval *pIStack_c0;
  Interval *local_b8;
  Interval **local_b0;
  Interval *diff_1;
  double dStack_a0;
  double local_98;
  undefined8 *local_90;
  Interval *diff;
  Interval diff_hi_;
  undefined1 auStack_60 [8];
  Interval diff_lo_;
  Interval *diff_dst_;
  undefined1 auStack_38 [4];
  ScopedRoundingMode diff_ctx_;
  Interval ret;
  IArgs *iargs_local;
  EvalContext *ctx_local;
  Sub *this_local;
  
  bVar6 = tcu::Interval::isOrdinary(iargs->a);
  if ((bVar6) && (bVar6 = tcu::Interval::isOrdinary(iargs->b), bVar6)) {
    tcu::Interval::Interval((Interval *)auStack_38);
    do {
      tcu::ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&diff_dst_ + 4));
      diff_lo_.m_hi = (double)auStack_38;
      tcu::Interval::Interval((Interval *)auStack_60);
      tcu::Interval::Interval((Interval *)&diff);
      local_90 = (undefined8 *)auStack_60;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar1 = tcu::Interval::lo(iargs->a);
      dVar2 = tcu::Interval::hi(iargs->b);
      tcu::Interval::Interval((Interval *)&diff_1,dVar1 - dVar2);
      puVar5 = local_90;
      local_90[2] = local_98;
      dVar1 = dStack_a0;
      *puVar5 = diff_1;
      puVar5[1] = dVar1;
      local_b0 = &diff;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar1 = tcu::Interval::hi(iargs->a);
      dVar2 = tcu::Interval::lo(iargs->b);
      tcu::Interval::Interval((Interval *)&local_c8,dVar1 - dVar2);
      ppIVar4 = local_b0;
      local_b0[2] = local_b8;
      pIVar3 = pIStack_c0;
      *ppIVar4 = local_c8;
      ppIVar4[1] = pIVar3;
      tcu::Interval::operator|(&local_e0,(Interval *)auStack_60,(Interval *)&diff);
      dVar1 = diff_lo_.m_hi;
      *(undefined8 *)diff_lo_.m_hi = local_e0._0_8_;
      *(double *)((long)dVar1 + 8) = local_e0.m_lo;
      *(double *)((long)dVar1 + 0x10) = local_e0.m_hi;
      tcu::ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&diff_dst_ + 4));
      dVar7 = ::deGetFalse();
    } while (dVar7 != 0);
    tcu::FloatFormat::roundOut(&local_f8,&ctx->format,(Interval *)auStack_38,true);
    tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,&local_f8);
  }
  else {
    FloatFunc2::applyMonotone(__return_storage_ptr__,(FloatFunc2 *)this,ctx,iargs->a,iargs->b);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval	doApply		(const EvalContext&	ctx, const IArgs& iargs) const
	{
		// Fast-path for common case
		if (iargs.a.isOrdinary() && iargs.b.isOrdinary())
		{
			Interval ret;

			TCU_SET_INTERVAL_BOUNDS(ret, diff,
									diff = iargs.a.lo() - iargs.b.hi(),
									diff = iargs.a.hi() - iargs.b.lo());
			return ctx.format.convert(ctx.format.roundOut(ret, true));

		}
		else
		{
			return this->applyMonotone(ctx, iargs.a, iargs.b);
		}
	}